

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaDec.c
# Opt level: O1

ELzmaDummy LzmaDec_TryDummy(CLzmaDec *p,Byte *buf,Byte **bufOut)

{
  byte *pbVar1;
  bool bVar2;
  uint symbol;
  uint uVar3;
  ELzmaDummy EVar4;
  ulong uVar5;
  byte bVar6;
  uint uVar7;
  int iVar8;
  byte bVar9;
  uint uVar10;
  SizeT SVar11;
  int iVar12;
  ELzmaDummy EVar13;
  uint uVar14;
  CLzmaProb *pCVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  UInt32 UVar19;
  uint uVar20;
  int iVar21;
  long lVar22;
  
  uVar16 = p->range;
  UVar19 = p->code;
  pbVar1 = *bufOut;
  pCVar15 = p->probs_1664;
  uVar3 = p->state;
  uVar14 = p->processedPos;
  uVar10 = (~(-1 << ((p->prop).pb & 0x1f)) & uVar14) * 0x10;
  if (uVar16 < 0x1000000) {
    if (pbVar1 <= buf) {
LAB_00198ce3:
      EVar13 = (ELzmaDummy)p;
      bVar6 = 1;
      goto LAB_00199052;
    }
    uVar16 = uVar16 << 8;
    bVar6 = *buf;
    buf = buf + 1;
    UVar19 = UVar19 << 8 | (uint)bVar6;
  }
  uVar17 = (uVar16 >> 0xb) * (uint)pCVar15[(ulong)(uVar10 + uVar3) - 0x100];
  uVar7 = UVar19 - uVar17;
  if (uVar17 <= UVar19) {
    uVar16 = uVar16 - uVar17;
    EVar13 = (ELzmaDummy)pCVar15[(ulong)uVar3 + 0x10];
    if (uVar16 < 0x1000000) {
      if (buf < pbVar1) {
        uVar16 = uVar16 * 0x100;
        bVar6 = *buf;
        buf = buf + 1;
        uVar7 = uVar7 * 0x100 | (uint)bVar6;
        goto LAB_00198b21;
      }
      bVar6 = 1;
      bVar9 = 0;
    }
    else {
LAB_00198b21:
      uVar17 = (uVar16 >> 0xb) * (uint)pCVar15[(ulong)uVar3 + 0x10];
      uVar14 = uVar7 - uVar17;
      if (uVar7 < uVar17) {
        EVar13 = DUMMY_MATCH;
        lVar22 = -0x600;
        uVar20 = uVar7;
        uVar14 = uVar17;
        goto LAB_00198b45;
      }
      uVar18 = uVar16 - uVar17;
      if (uVar18 < 0x1000000) {
        uVar16 = uVar18;
        if (buf < pbVar1) {
          uVar18 = uVar18 * 0x100;
          bVar6 = *buf;
          buf = buf + 1;
          uVar14 = uVar14 * 0x100 | (uint)bVar6;
          goto LAB_00198bbb;
        }
LAB_00198d9f:
        bVar6 = 1;
LAB_00198da4:
        EVar13 = DUMMY_REP;
      }
      else {
LAB_00198bbb:
        uVar16 = (uVar18 >> 0xb) * (uint)pCVar15[(ulong)uVar3 + 0x1c];
        uVar20 = uVar14 - uVar16;
        if (uVar14 < uVar16) {
          if (uVar16 < 0x1000000) {
            if (pbVar1 <= buf) goto LAB_00198d9f;
            uVar16 = uVar16 * 0x100;
            bVar6 = *buf;
            buf = buf + 1;
            uVar14 = uVar14 << 8 | (uint)bVar6;
          }
          uVar18 = (uVar16 >> 0xb) * (uint)pCVar15[(ulong)(uVar10 + uVar3) - 0x600];
          if (uVar14 < uVar18) {
            bVar6 = 2;
            uVar16 = uVar18;
            goto LAB_00198da4;
          }
          EVar13 = DUMMY_REP;
          lVar22 = -0xa00;
          uVar20 = uVar14 - uVar18;
          uVar14 = uVar16 - uVar18;
LAB_00198b45:
          if (uVar14 < 0x1000000) {
            uVar18 = uVar20;
            if (buf < pbVar1) {
              uVar14 = uVar14 << 8;
              bVar6 = *buf;
              buf = buf + 1;
              uVar20 = (uint)bVar6 | uVar20 << 8;
              goto LAB_00198c1a;
            }
LAB_00198d27:
            bVar2 = false;
            uVar16 = uVar14;
          }
          else {
LAB_00198c1a:
            uVar16 = (uVar14 >> 0xb) * (uint)*(ushort *)((long)pCVar15 + lVar22);
            uVar18 = uVar20 - uVar16;
            if (uVar20 < uVar16) {
              lVar22 = (long)pCVar15 + (ulong)uVar10 * 2 + lVar22;
              iVar8 = 0;
              uVar14 = 8;
            }
            else {
              uVar14 = uVar14 - uVar16;
              if (uVar14 < 0x1000000) {
                if (pbVar1 <= buf) goto LAB_00198d27;
                uVar14 = uVar14 * 0x100;
                bVar6 = *buf;
                buf = buf + 1;
                uVar18 = (uint)bVar6 | uVar18 * 0x100;
              }
              uVar16 = (uVar14 >> 0xb) * (uint)*(ushort *)((long)pCVar15 + lVar22 + 0x10);
              uVar20 = uVar18 - uVar16;
              if (uVar18 < uVar16) {
                lVar22 = (long)pCVar15 + (ulong)uVar10 * 2 + lVar22 + 0x10;
                uVar14 = 8;
                iVar8 = 8;
                uVar20 = uVar18;
              }
              else {
                uVar16 = uVar14 - uVar16;
                lVar22 = (long)pCVar15 + lVar22 + 0x200;
                iVar8 = 0x10;
                uVar14 = 0x100;
              }
            }
            uVar5 = 1;
            uVar18 = uVar20;
            do {
              uVar3 = (uint)uVar5;
              if (uVar16 < 0x1000000) {
                if (pbVar1 <= buf) {
                  bVar2 = false;
                  goto LAB_00198e62;
                }
                uVar16 = uVar16 << 8;
                bVar6 = *buf;
                buf = buf + 1;
                uVar18 = uVar18 << 8 | (uint)bVar6;
              }
              uVar10 = (uVar16 >> 0xb) * (uint)*(ushort *)(lVar22 + uVar5 * 2);
              uVar20 = uVar18 - uVar10;
              if (uVar18 < uVar10) {
                uVar3 = uVar3 * 2;
              }
              else {
                uVar10 = uVar16 - uVar10;
                uVar3 = uVar3 * 2 + 1;
                uVar18 = uVar20;
              }
              uVar5 = (ulong)uVar3;
              uVar16 = uVar10;
            } while (uVar3 < uVar14);
            uVar3 = (iVar8 - uVar14) + uVar3;
            bVar2 = true;
          }
LAB_00198e62:
          bVar6 = 0;
          if (bVar2) {
            bVar9 = 1;
            if (uVar7 < uVar17) {
              uVar14 = 3;
              if (uVar3 < 3) {
                uVar14 = uVar3;
              }
              uVar5 = 1;
              uVar3 = uVar16;
              do {
                if (uVar3 < 0x1000000) {
                  uVar16 = uVar3;
                  if (pbVar1 <= buf) goto LAB_0019903c;
                  uVar3 = uVar3 << 8;
                  bVar6 = *buf;
                  buf = buf + 1;
                  uVar18 = uVar18 << 8 | (uint)bVar6;
                }
                uVar16 = (uVar3 >> 0xb) *
                         (uint)*(ushort *)((long)pCVar15 + uVar5 * 2 + (ulong)(uVar14 << 7) + 0x80);
                uVar10 = uVar18 - uVar16;
                if (uVar18 < uVar16) {
                  uVar17 = (int)uVar5 * 2;
                }
                else {
                  uVar16 = uVar3 - uVar16;
                  uVar17 = (int)uVar5 * 2 + 1;
                  uVar18 = uVar10;
                }
                uVar5 = (ulong)uVar17;
                uVar3 = uVar16;
              } while (uVar17 < 0x40);
              uVar3 = uVar17 - 0x40;
              bVar9 = 1;
              if (3 < uVar3) {
                if (uVar3 < 0xe) {
                  iVar8 = (uVar3 >> 1) - 1;
                  pCVar15 = pCVar15 + ((ulong)((uVar17 & 1 | 2) << ((byte)iVar8 & 0x1f)) - 0x680);
                }
                else {
                  iVar8 = (uVar3 >> 1) - 5;
                  do {
                    if (uVar16 < 0x1000000) {
                      if (pbVar1 <= buf) goto LAB_0019903c;
                      uVar16 = uVar16 << 8;
                      bVar6 = *buf;
                      buf = buf + 1;
                      uVar18 = uVar18 << 8 | (uint)bVar6;
                    }
                    uVar16 = uVar16 >> 1;
                    uVar3 = 0;
                    if (-1 < (int)(uVar18 - uVar16)) {
                      uVar3 = uVar16;
                    }
                    uVar18 = uVar18 - uVar3;
                    iVar8 = iVar8 + -1;
                  } while (iVar8 != 0);
                  iVar8 = 4;
                }
                uVar14 = 1;
                iVar12 = 1;
                uVar3 = uVar16;
                do {
                  if (uVar3 < 0x1000000) {
                    uVar16 = uVar3;
                    if (pbVar1 <= buf) goto LAB_0019903c;
                    uVar3 = uVar3 << 8;
                    bVar6 = *buf;
                    buf = buf + 1;
                    uVar18 = uVar18 << 8 | (uint)bVar6;
                  }
                  uVar16 = (uVar3 >> 0xb) * (uint)pCVar15[uVar14];
                  uVar10 = uVar18 - uVar16;
                  iVar21 = iVar12;
                  if (uVar16 <= uVar18) {
                    uVar16 = uVar3 - uVar16;
                    iVar21 = iVar12 * 2;
                    uVar18 = uVar10;
                  }
                  iVar12 = iVar12 * 2;
                  uVar14 = uVar14 + iVar21;
                  iVar8 = iVar8 + -1;
                  uVar3 = uVar16;
                } while (iVar8 != 0);
              }
              goto LAB_0019903e;
            }
            goto LAB_00199046;
          }
        }
        else {
          uVar16 = uVar18 - uVar16;
          if (uVar16 < 0x1000000) {
            if (pbVar1 <= buf) {
              bVar6 = 1;
              EVar13 = DUMMY_REP;
              bVar9 = 0;
              goto LAB_00199046;
            }
            uVar16 = uVar16 * 0x100;
            bVar6 = *buf;
            buf = buf + 1;
            uVar20 = uVar20 * 0x100 | (uint)bVar6;
          }
          uVar14 = (uVar16 >> 0xb) * (uint)pCVar15[(ulong)uVar3 + 0x28];
          EVar13 = DUMMY_REP;
          lVar22 = -0xa00;
          uVar18 = uVar20 - uVar14;
          if (uVar20 < uVar14) goto LAB_00198b45;
          uVar16 = uVar16 - uVar14;
          if (0xffffff < uVar16) {
LAB_00198f5b:
            uVar3 = (uVar16 >> 0xb) * (uint)pCVar15[(ulong)uVar3 + 0x34];
            uVar20 = uVar18;
            uVar14 = uVar3;
            if (uVar3 <= uVar18) {
              uVar20 = uVar18 - uVar3;
              uVar14 = uVar16 - uVar3;
            }
            goto LAB_00198b45;
          }
          if (buf < pbVar1) {
            uVar16 = uVar16 * 0x100;
            bVar6 = *buf;
            buf = buf + 1;
            uVar18 = uVar18 * 0x100 | (uint)bVar6;
            goto LAB_00198f5b;
          }
        }
        bVar6 = 1;
      }
      bVar9 = 0;
    }
    goto LAB_00199046;
  }
  pCVar15 = pCVar15 + 0x140;
  if (p->checkDicSize != 0 || uVar14 != 0) {
    bVar6 = (p->prop).lc;
    SVar11 = p->dicPos;
    if (SVar11 == 0) {
      SVar11 = p->dicBufSize;
    }
    pCVar15 = pCVar15 + ((uint)(p->dic[SVar11 - 1] >> (8 - bVar6 & 0x1f)) +
                        ((uVar14 & ~(-1 << ((p->prop).lp & 0x1f))) << (bVar6 & 0x1f))) * 0x300;
  }
  if (uVar3 < 7) {
    uVar5 = 1;
    do {
      if (uVar17 < 0x1000000) {
        if (pbVar1 <= buf) {
          bVar2 = false;
          uVar16 = uVar17;
          goto joined_r0x00198cd8;
        }
        uVar17 = uVar17 << 8;
        bVar6 = *buf;
        buf = buf + 1;
        UVar19 = UVar19 << 8 | (uint)bVar6;
      }
      uVar16 = (uVar17 >> 0xb) * (uint)pCVar15[uVar5];
      if (UVar19 < uVar16) {
        uVar3 = (int)uVar5 * 2;
        uVar17 = uVar16;
      }
      else {
        uVar17 = uVar17 - uVar16;
        uVar3 = (int)uVar5 * 2 + 1;
        UVar19 = UVar19 - uVar16;
      }
      uVar5 = (ulong)uVar3;
    } while (uVar3 < 0x100);
    bVar2 = true;
    uVar16 = uVar17;
  }
  else {
    if (p->dicPos < (ulong)p->reps[0]) {
      SVar11 = p->dicBufSize;
    }
    else {
      SVar11 = 0;
    }
    uVar14 = (uint)p->dic[SVar11 + (p->dicPos - (ulong)p->reps[0])];
    uVar3 = 1;
    p = (CLzmaDec *)0x100;
    uVar16 = uVar17;
    do {
      uVar14 = uVar14 * 2;
      uVar17 = (uint)p;
      uVar10 = uVar17 & uVar14;
      if (uVar16 < 0x1000000) {
        if (buf < pbVar1) {
          uVar16 = uVar16 << 8;
          bVar6 = *buf;
          buf = buf + 1;
          UVar19 = UVar19 << 8 | (uint)bVar6;
          goto LAB_00198c88;
        }
        bVar2 = false;
      }
      else {
LAB_00198c88:
        uVar7 = (uVar16 >> 0xb) * (uint)pCVar15[uVar17 + uVar3 + uVar10];
        if (UVar19 < uVar7) {
          uVar3 = uVar3 * 2;
          uVar10 = uVar10 ^ uVar17;
          bVar2 = true;
          uVar16 = uVar7;
        }
        else {
          uVar16 = uVar16 - uVar7;
          uVar3 = uVar3 * 2 + 1;
          bVar2 = true;
          UVar19 = UVar19 - uVar7;
        }
      }
      p = (CLzmaDec *)(ulong)uVar10;
      if (!bVar2) goto LAB_00198ce3;
    } while (uVar3 < 0x100);
  }
joined_r0x00198cd8:
  bVar6 = 1;
  EVar13 = DUMMY_LIT;
  EVar4 = DUMMY_LIT;
  if (!bVar2) goto LAB_00199052;
  goto LAB_0019904d;
LAB_0019903c:
  bVar9 = 0;
LAB_0019903e:
  bVar6 = bVar9 ^ 1;
LAB_00199046:
  EVar4 = EVar13;
  if (bVar9 == 0) goto LAB_00199052;
LAB_0019904d:
  EVar13 = EVar4;
  bVar6 = 2;
LAB_00199052:
  EVar4 = DUMMY_INPUT_EOF;
  if (bVar6 == 2) {
    if (uVar16 < 0x1000000) {
      if (pbVar1 <= buf) {
        return DUMMY_INPUT_EOF;
      }
      buf = buf + 1;
    }
    *bufOut = buf;
    EVar4 = EVar13;
  }
  return EVar4;
}

Assistant:

static ELzmaDummy LzmaDec_TryDummy(const CLzmaDec *p, const Byte *buf, const Byte **bufOut)
{
  UInt32 range = p->range;
  UInt32 code = p->code;
  const Byte *bufLimit = *bufOut;
  const CLzmaProb *probs = GET_PROBS;
  unsigned state = (unsigned)p->state;
  ELzmaDummy res;

  for (;;)
  {
    const CLzmaProb *prob;
    UInt32 bound;
    unsigned ttt;
    unsigned posState = CALC_POS_STATE(p->processedPos, ((unsigned)1 << p->prop.pb) - 1);

    prob = probs + IsMatch + COMBINED_PS_STATE;
    IF_BIT_0_CHECK(prob)
    {
      UPDATE_0_CHECK

      prob = probs + Literal;
      if (p->checkDicSize != 0 || p->processedPos != 0)
        prob += ((UInt32)LZMA_LIT_SIZE *
            ((((p->processedPos) & (((unsigned)1 << (p->prop.lp)) - 1)) << p->prop.lc) +
            ((unsigned)p->dic[(p->dicPos == 0 ? p->dicBufSize : p->dicPos) - 1] >> (8 - p->prop.lc))));

      if (state < kNumLitStates)
      {
        unsigned symbol = 1;
        do { GET_BIT_CHECK(prob + symbol, symbol) } while (symbol < 0x100);
      }
      else
      {
        unsigned matchByte = p->dic[p->dicPos - p->reps[0] +
            (p->dicPos < p->reps[0] ? p->dicBufSize : 0)];
        unsigned offs = 0x100;
        unsigned symbol = 1;
        do
        {
          unsigned bit;
          const CLzmaProb *probLit;
          matchByte += matchByte;
          bit = offs;
          offs &= matchByte;
          probLit = prob + (offs + bit + symbol);
          GET_BIT2_CHECK(probLit, symbol, offs ^= bit; , ; )
        }
        while (symbol < 0x100);
      }
      res = DUMMY_LIT;
    }
    else
    {
      unsigned len;
      UPDATE_1_CHECK

      prob = probs + IsRep + state;
      IF_BIT_0_CHECK(prob)
      {
        UPDATE_0_CHECK
        state = 0;
        prob = probs + LenCoder;
        res = DUMMY_MATCH;
      }
      else
      {
        UPDATE_1_CHECK
        res = DUMMY_REP;
        prob = probs + IsRepG0 + state;
        IF_BIT_0_CHECK(prob)
        {
          UPDATE_0_CHECK
          prob = probs + IsRep0Long + COMBINED_PS_STATE;
          IF_BIT_0_CHECK(prob)
          {
            UPDATE_0_CHECK
            break;
          }
          else
          {
            UPDATE_1_CHECK
          }
        }
        else
        {
          UPDATE_1_CHECK
          prob = probs + IsRepG1 + state;
          IF_BIT_0_CHECK(prob)
          {
            UPDATE_0_CHECK
          }
          else
          {
            UPDATE_1_CHECK
            prob = probs + IsRepG2 + state;
            IF_BIT_0_CHECK(prob)
            {
              UPDATE_0_CHECK
            }
            else
            {
              UPDATE_1_CHECK
            }
          }
        }
        state = kNumStates;
        prob = probs + RepLenCoder;
      }